

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::encodeField(JsonCodec *this,Field field,Reader *input,Builder output)

{
  undefined8 *puVar1;
  Type type;
  long local_c8;
  Reader local_c0;
  Reader local_78;
  
  kj::
  Table<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>>
  ::find<0ul,capnp::StructSchema::Field&>
            ((Table<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry,kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Callbacks>>
              *)&local_c8,(Field *)&((this->impl).ptr)->fieldHandlers);
  if (local_c8 != 0) {
    puVar1 = *(undefined8 **)(local_c8 + 0x40);
    DynamicValue::Reader::Reader(&local_78,input);
    (**(code **)*puVar1)(puVar1,this,&local_78);
    DynamicValue::Reader::~Reader(&local_78);
    if (local_c8 != 0) {
      return;
    }
  }
  DynamicValue::Reader::Reader(&local_c0,input);
  type = StructSchema::Field::getType(&field);
  encode(this,&local_c0,type,output);
  DynamicValue::Reader::~Reader(&local_c0);
  return;
}

Assistant:

void JsonCodec::encodeField(StructSchema::Field field, DynamicValue::Reader input,
                            JsonValue::Builder output) const {
  KJ_IF_SOME(handler, impl->fieldHandlers.find(field)) {
    handler->encodeBase(*this, input, output);
    return;
  }

  encode(input, field.getType(), output);
}